

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O0

pool_ptr<soul::Module> __thiscall
soul::Program::ProgramImpl::findModuleContainingFunction(ProgramImpl *this,Function *f)

{
  bool bVar1;
  size_t *this_00;
  reference this_01;
  Module *pMVar2;
  Function *in_RDX;
  pool_ref<soul::Module> *m;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *__range2;
  Function *f_local;
  ProgramImpl *this_local;
  
  this_00 = &(f->parameters).numActive;
  __end2 = std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ::begin((vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
                    *)this_00);
  m = (pool_ref<soul::Module> *)
      std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::end
                ((vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
                  *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
                                *)&m);
    if (!bVar1) {
      pool_ptr<soul::Module>::pool_ptr((pool_ptr<soul::Module> *)this);
      return (pool_ptr<soul::Module>)(Module *)this;
    }
    this_01 = __gnu_cxx::
              __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
              ::operator*(&__end2);
    pMVar2 = pool_ref<soul::Module>::operator->(this_01);
    bVar1 = Module::Functions::contains(&pMVar2->functions,in_RDX);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
    ::operator++(&__end2);
  }
  pool_ref::operator_cast_to_pool_ptr((pool_ref *)this);
  return (pool_ptr<soul::Module>)(Module *)this;
}

Assistant:

pool_ptr<Module> findModuleContainingFunction (const heart::Function& f) const
    {
        for (auto& m : modules)
            if (m->functions.contains (f))
                return m;

        return {};
    }